

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O3

int encode_mcu_AC_refine_prepare
              (JCOEF *block,int *jpeg_natural_order_start,int Sl,int Al,JCOEF *absvalues,
              size_t *bits)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  
  if (Sl < 1) {
    iVar3 = 0;
    sVar8 = 0;
    sVar7 = 0;
  }
  else {
    uVar5 = 0;
    sVar7 = 0;
    sVar8 = 0;
    uVar4 = 0;
    do {
      uVar9 = (uint)block[jpeg_natural_order_start[uVar5]];
      uVar2 = -uVar9;
      if (0 < (int)uVar9) {
        uVar2 = uVar9;
      }
      bVar1 = (byte)Al & 0x1f;
      uVar6 = uVar2 >> bVar1;
      if (uVar2 >> bVar1 != 0) {
        sVar8 = sVar8 | 1L << (uVar5 & 0x3f);
        sVar7 = sVar7 | (ulong)(((int)uVar9 >> 0x1f) + 1) << ((byte)uVar5 & 0x3f);
      }
      absvalues[uVar5] = (JCOEF)uVar6;
      if (uVar6 == 1) {
        uVar4 = uVar5 & 0xffffffff;
      }
      iVar3 = (int)uVar4;
      uVar5 = uVar5 + 1;
    } while ((uint)Sl != uVar5);
  }
  *bits = sVar8;
  bits[1] = sVar7;
  return iVar3;
}

Assistant:

METHODDEF(int)
encode_mcu_AC_refine_prepare(const JCOEF *block,
                             const int *jpeg_natural_order_start, int Sl,
                             int Al, JCOEF *absvalues, size_t *bits)
{
  register int k, temp, temp2;
  int EOB = 0;
  size_t zerobits = 0U, signbits = 0U;
  int Sl0 = Sl;

#if SIZEOF_SIZE_T == 4
  if (Sl0 > 32)
    Sl0 = 32;
#endif

  COMPUTE_ABSVALUES_AC_REFINE(Sl0, 0);

  bits[0] = zerobits;
#if SIZEOF_SIZE_T == 8
  bits[1] = signbits;
#else
  bits[2] = signbits;

  zerobits = 0U;
  signbits = 0U;

  if (Sl > 32) {
    Sl -= 32;
    jpeg_natural_order_start += 32;
    absvalues += 32;

    COMPUTE_ABSVALUES_AC_REFINE(Sl, 32);
  }

  bits[1] = zerobits;
  bits[3] = signbits;
#endif

  return EOB;
}